

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O0

int __thiscall mp::BinaryFormatter::apr(BinaryFormatter *this,File *f,char *fmt,...)

{
  char cVar1;
  undefined4 uVar2;
  char in_AL;
  long lVar3;
  size_t sVar4;
  NLUtils *pNVar5;
  undefined8 in_RCX;
  char *pcVar6;
  char *in_RDX;
  File *in_RSI;
  BinaryFormatter *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  size_t x;
  size_t len;
  int rc;
  int i;
  char *s;
  U u;
  FILE *fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdac;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  undefined1 local_178 [24];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  size_t local_40;
  int local_38;
  int local_34;
  char *local_30;
  undefined8 local_28;
  FILE *local_20;
  char *local_18;
  File *local_10;
  BinaryFormatter *local_8;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  local_160 = in_RCX;
  local_158 = in_R8;
  local_150 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (FILE *)File::GetHandle(in_RSI);
  local_38 = 0;
  local_68.field_2._M_allocated_capacity = (size_type)local_178;
  local_68._M_string_length = (size_type)&stack0x00000008;
  local_68._4_4_ = 0x30;
  local_68._0_4_ = 0x18;
  cVar1 = *local_18;
  local_34 = (int)cVar1;
  if ((local_34 != 0x25) && (local_18 = local_18 + 1, local_34 != 0x69)) {
    local_28 = CONCAT71(local_28._1_7_,cVar1);
    fwrite(&local_28,1,1,local_20);
    local_38 = local_38 + 1;
  }
  do {
    for (; uVar2 = local_68._0_4_, *local_18 == ' '; local_18 = local_18 + 1) {
    }
    if (*local_18 != '%') {
      return local_38;
    }
    pcVar6 = local_18 + 2;
    switch(local_18[1]) {
    case '.':
      local_18 = pcVar6;
      do {
        cVar1 = *local_18;
        pcVar6 = local_18 + 1;
        local_18 = local_18 + 1;
      } while (cVar1 != 'g');
    case 'g':
      local_18 = pcVar6;
      if ((uint)local_68._4_4_ < 0xa1) {
        local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._4_4_ + local_68.field_2._M_allocated_capacity);
        local_68._4_4_ = local_68._4_4_ + 0x10;
      }
      else {
        local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_28 = *(undefined8 *)local_1d8;
      local_40 = 8;
      pcVar6 = local_18;
      break;
    default:
      local_18 = pcVar6;
      pNVar5 = Utils(in_RDI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,
                 (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (allocator<char> *)in_stack_fffffffffffffdd0);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda0);
      (*pNVar5->_vptr_NLUtils[7])(pNVar5,local_88);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      pcVar6 = local_18;
      break;
    case 'c':
      if ((uint)local_68._0_4_ < 0x29) {
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_28 = CONCAT71(local_28._1_7_,(char)*(undefined4 *)local_1a0);
      local_40 = 1;
      break;
    case 'd':
      if ((uint)local_68._0_4_ < 0x29) {
        local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_28 = CONCAT44(local_28._4_4_,*(undefined4 *)local_1b8);
      local_40 = 4;
      break;
    case 'h':
      if ((uint)local_68._0_4_ < 0x29) {
        local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_28 = CONCAT62(local_28._2_6_,(short)*(undefined4 *)local_1f0);
      local_40 = 2;
      if (*pcVar6 == 'd') {
        pcVar6 = local_18 + 3;
      }
      break;
    case 'l':
      if ((uint)local_68._0_4_ < 0x29) {
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_28 = CONCAT44(local_28._4_4_,(int)*(undefined8 *)local_208);
      local_40 = 4;
      if (*pcVar6 == 'd') {
        pcVar6 = local_18 + 3;
      }
      break;
    case 's':
      if ((uint)local_68._0_4_ < 0x29) {
        lVar3 = (long)(int)local_68._0_4_;
        local_68._0_4_ = local_68._0_4_ + 8;
        in_stack_fffffffffffffde0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar3 + local_68.field_2._M_allocated_capacity);
      }
      else {
        in_stack_fffffffffffffde0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_68._M_string_length;
        local_68._M_string_length = (size_type)(local_68._M_string_length + 8);
      }
      local_30 = *(char **)in_stack_fffffffffffffde0;
      local_18 = pcVar6;
      sVar4 = strlen(local_30);
      local_28 = CONCAT44(local_28._4_4_,(int)sVar4);
      fwrite(&local_28,4,1,local_20);
      fwrite(local_30,(long)(int)local_28,1,local_20);
      goto LAB_0012db6f;
    case 'z':
      in_stack_fffffffffffffdd0 = &local_68;
      if ((uint)local_68._0_4_ < 0x29) {
        local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_48 = *(undefined8 *)local_238;
      local_28 = CONCAT44(local_28._4_4_,(int)local_48);
      local_40 = 4;
      in_stack_fffffffffffffddc = uVar2;
    }
    local_18 = pcVar6;
    fwrite(&local_28,local_40,1,local_20);
LAB_0012db6f:
    uVar7 = local_68._0_4_;
    local_38 = local_38 + 1;
    if (*local_18 == ':') {
      in_stack_fffffffffffffda0 = &local_68;
      if ((uint)local_68._0_4_ < 0x29) {
        local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(int)local_68._0_4_ + local_68.field_2._M_allocated_capacity);
        local_68._0_4_ = local_68._0_4_ + 8;
      }
      else {
        local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_68._M_string_length;
        local_68._M_string_length = local_68._M_string_length + 8;
      }
      local_30 = *(char **)local_268;
      fwrite(local_30,(long)(int)local_28,1,local_20);
      local_18 = local_18 + 3;
      local_38 = local_38 + 1;
      in_stack_fffffffffffffdac = uVar7;
    }
  } while( true );
}

Assistant:

int BinaryFormatter::
apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  U u;
  char *s;
  int i, rc;
  size_t len, x;
  va_list ap;

  rc = 0;
  va_start(ap, fmt);

  if ((i = *fmt) != '%') {
    fmt++;
#define DMG
#ifdef DMG
    if (i != 'i')
#endif
    {
      u.c = i;
      fwrite(&u.c, 1, 1, fd);
      rc++;
    }}

  for(;;) {
    while(*fmt == ' ')
      fmt++;
    if (*fmt++ != '%')
      break;
    switch(*fmt++) {
    case 'c':
      u.c = va_arg(ap, int);
      len = 1;
      break;
    case 'd':
      u.i = va_arg(ap, int);
      len = sizeof(Int);
      break;
    case '.':
      while(*fmt++ != 'g');
    case 'g':
      u.x = va_arg(ap, double);
      len = sizeof(double);
      break;
    case 'h':
      u.sh = va_arg(ap, int);
      len = sizeof(short);
      if (*fmt == 'd')
        fmt++;
      break;
    case 'l':
      u.L = (Long)va_arg(ap, long);
      len = sizeof(Long);
      if (*fmt == 'd')
        fmt++;
      break;
    case 's':
      s = va_arg(ap, char*);
      u.i = std::strlen(s);
      fwrite((char *)&u.i, sizeof(Int), 1, fd);
      fwrite(s, u.i, 1, fd);
      goto s_written;
    case 'z':
      x = va_arg(ap, size_t);
      u.L = (Long)x;
      len = sizeof(Long);
      break;
    default:
      Utils().myexit("bprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
#ifdef AVOID_BOGUS_WARNINGS
      len = 0;
#endif
    }
    fwrite((char *)&u.L, len, 1, fd);
s_written:
    rc++;
    if (*fmt == ':') {
      /* special Hollerith */
      s = va_arg(ap, char*);
      fwrite(s, u.i, 1, fd);
      fmt += 3;
      rc++;
    }
  }
  va_end(ap);
  return rc;
}